

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

int skip_blank(char **pp,char *end)

{
  char *pcVar1;
  bool bVar2;
  int local_30;
  char *pcStack_28;
  int c;
  char *p;
  char *end_local;
  char **pp_local;
  
  pcStack_28 = *pp;
  while( true ) {
    if (pcStack_28 == end) goto LAB_001c4cb1;
    local_30 = (int)*pcStack_28;
    if ((local_30 != 0x20) && (local_30 != 9)) break;
    pcStack_28 = pcStack_28 + 1;
  }
  if ((local_30 != 0x3b) &&
     (((local_30 != 0x2f || (pcStack_28 + 1 == end)) || (pcStack_28[1] != '/')))) {
    bVar2 = is_eol(local_30);
    if (((bVar2) && (pcStack_28 + 1 != end)) && (pcStack_28[1] == '\n')) {
      pcStack_28 = pcStack_28 + 1;
    }
    *pp = pcStack_28;
    bVar2 = is_eol(local_30);
    if (bVar2) {
      local_30 = 0x100;
    }
    return local_30;
  }
  while (pcVar1 = pcStack_28, pcStack_28 = pcVar1 + 1, pcStack_28 != end) {
    bVar2 = is_eol((int)*pcStack_28);
    if (bVar2) {
      if ((pcVar1 + 2 != end) && (pcVar1[2] == '\n')) {
        pcStack_28 = pcVar1 + 2;
      }
      *pp = pcStack_28;
      return 0x100;
    }
  }
LAB_001c4cb1:
  *pp = end;
  return 0x101;
}

Assistant:

static int skip_blank(const char** pp, const char* end)
{
	for (const char* p = *pp; p != end; ++p) {
		int c = *p;
		if (c == ' ' || c == '\t') {
			// skip whitespace
			continue;
		}
		if (c == ';' || (c == '/' && (p + 1) != end && *(p + 1) == '/')) {
			// skip comment
			for (++p;; ++p) {
				if (p == end)
					goto eof_reached;
				c = *p;
				if (is_eol(c)) {
					if ((p + 1) != end && *(p + 1) == '\n')
						p++;
					*pp = p;
					return IF_EOL;
				}
			}
		}
		if (is_eol(c) && (p + 1) != end && *(p + 1) == '\n')
			p++;
		*pp = p;
		return is_eol(c)? IF_EOL : c;
	}
eof_reached:
	*pp = end;
	return IF_EOF;
}